

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall cmFindPackageCommand::FindConfig(cmFindPackageCommand *this)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1d8;
  undefined1 local_1b8 [8];
  string init;
  cmAlphaNum local_168;
  string local_138;
  cmAlphaNum local_118;
  cmAlphaNum local_e8;
  string local_b8;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  string local_38;
  byte local_11;
  cmFindPackageCommand *pcStack_10;
  bool found;
  cmFindPackageCommand *this_local;
  
  pcStack_10 = this;
  ComputePrefixes(this);
  local_11 = 0;
  if (((this->super_cmFindCommon).DebugMode & 1U) != 0) {
    cmAlphaNum::cmAlphaNum(&local_68,&this->DebugBuffer);
    cmAlphaNum::cmAlphaNum(&local_98,"find_package considered the following locations for ");
    cmStrCat<std::__cxx11::string,char[19]>
              (&local_38,&local_68,&local_98,&this->Name,(char (*) [19])"\'s Config module:\n");
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if (((local_11 & 1) == 0) &&
     ((((this->super_cmFindCommon).SearchFrameworkFirst & 1U) != 0 ||
      (((this->super_cmFindCommon).SearchFrameworkOnly & 1U) != 0)))) {
    local_11 = FindFrameworkConfig(this);
  }
  if (((local_11 & 1) == 0) &&
     ((((this->super_cmFindCommon).SearchAppBundleFirst & 1U) != 0 ||
      (((this->super_cmFindCommon).SearchAppBundleOnly & 1U) != 0)))) {
    local_11 = FindAppBundleConfig(this);
  }
  if ((((local_11 & 1) == 0) && (((this->super_cmFindCommon).SearchFrameworkOnly & 1U) == 0)) &&
     (((this->super_cmFindCommon).SearchAppBundleOnly & 1U) == 0)) {
    local_11 = FindPrefixedConfig(this);
  }
  if (((local_11 & 1) == 0) && (((this->super_cmFindCommon).SearchFrameworkLast & 1U) != 0)) {
    local_11 = FindFrameworkConfig(this);
  }
  if (((local_11 & 1) == 0) && (((this->super_cmFindCommon).SearchAppBundleLast & 1U) != 0)) {
    local_11 = FindAppBundleConfig(this);
  }
  if (((this->super_cmFindCommon).DebugMode & 1U) != 0) {
    if ((local_11 & 1) == 0) {
      cmAlphaNum::cmAlphaNum(&local_168,&this->DebugBuffer);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&init.field_2 + 8),"The file was not found.\n");
      cmStrCat<>(&local_138,&local_168,(cmAlphaNum *)((long)&init.field_2 + 8));
      std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_138);
      std::__cxx11::string::~string((string *)&local_138);
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_e8,&this->DebugBuffer);
      cmAlphaNum::cmAlphaNum(&local_118,"The file was found at\n  ");
      cmStrCat<std::__cxx11::string,char[2]>
                (&local_b8,&local_e8,&local_118,&this->FileFound,(char (*) [2])0xde26c0);
      std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
  }
  std::__cxx11::string::string((string *)local_1b8);
  if ((local_11 & 1) == 0) {
    std::operator+(&local_208,&this->Variable,"-NOTFOUND");
    std::__cxx11::string::operator=((string *)local_1b8,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
  }
  else {
    cmsys::SystemTools::GetFilenamePath(&local_1d8,&this->FileFound);
    std::__cxx11::string::operator=((string *)local_1b8,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  SetConfigDirCacheVariable(this,(string *)local_1b8);
  bVar1 = local_11;
  std::__cxx11::string::~string((string *)local_1b8);
  return (bool)(bVar1 & 1);
}

Assistant:

bool cmFindPackageCommand::FindConfig()
{
  // Compute the set of search prefixes.
  this->ComputePrefixes();

  // Look for the project's configuration file.
  bool found = false;
  if (this->DebugMode) {
    this->DebugBuffer = cmStrCat(this->DebugBuffer,
                                 "find_package considered the following "
                                 "locations for ",
                                 this->Name, "'s Config module:\n");
  }

  // Search for frameworks.
  if (!found && (this->SearchFrameworkFirst || this->SearchFrameworkOnly)) {
    found = this->FindFrameworkConfig();
  }

  // Search for apps.
  if (!found && (this->SearchAppBundleFirst || this->SearchAppBundleOnly)) {
    found = this->FindAppBundleConfig();
  }

  // Search prefixes.
  if (!found && !(this->SearchFrameworkOnly || this->SearchAppBundleOnly)) {
    found = this->FindPrefixedConfig();
  }

  // Search for frameworks.
  if (!found && this->SearchFrameworkLast) {
    found = this->FindFrameworkConfig();
  }

  // Search for apps.
  if (!found && this->SearchAppBundleLast) {
    found = this->FindAppBundleConfig();
  }

  if (this->DebugMode) {
    if (found) {
      this->DebugBuffer = cmStrCat(
        this->DebugBuffer, "The file was found at\n  ", this->FileFound, "\n");
    } else {
      this->DebugBuffer =
        cmStrCat(this->DebugBuffer, "The file was not found.\n");
    }
  }

  // Store the entry in the cache so it can be set by the user.
  std::string init;
  if (found) {
    init = cmSystemTools::GetFilenamePath(this->FileFound);
  } else {
    init = this->Variable + "-NOTFOUND";
  }
  // We force the value since we do not get here if it was already set.
  this->SetConfigDirCacheVariable(init);

  return found;
}